

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptOperators::GetCallableObjectOrThrow(Var callee,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableObject *pRVar4;
  
  if (callee == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xe25,"(callee)","callee");
    if (!bVar2) goto LAB_0099c835;
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xe26,"(scriptContext)","scriptContext");
    if (!bVar2) {
LAB_0099c835:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TaggedNumber::Is(callee);
  if (!bVar2) {
    pRVar4 = UnsafeVarTo<Js::RecyclableObject>(callee);
    return pRVar4;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
}

Assistant:

RecyclableObject *JavascriptOperators::GetCallableObjectOrThrow(const Var callee, ScriptContext *const scriptContext)
    {
        Assert(callee);
        Assert(scriptContext);

        if (TaggedNumber::Is(callee))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction /* TODO-ERROR: get arg name - aFunc */);
        }
        return UnsafeVarTo<RecyclableObject>(callee);
    }